

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O3

int __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeLinear>::GetSideOrient
          (TPZCompElHDivCollapsed<pzshape::TPZShapeLinear> *this,int side)

{
  int iVar1;
  
  if (3 < (uint)side) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHDivCollapsed.cpp"
               ,0xac);
  }
  if (side < 2) {
    iVar1 = TPZCompElHDiv<pzshape::TPZShapeLinear>::GetSideOrient
                      (&this->super_TPZCompElHDiv<pzshape::TPZShapeLinear>,side);
    return iVar1;
  }
  if (side == 2) {
    iVar1 = this->fbottom_side_orient;
  }
  else {
    iVar1 = this->ftop_side_orient;
  }
  return iVar1;
}

Assistant:

int TPZCompElHDivCollapsed<TSHAPE>::GetSideOrient(int side)
{
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    if (side < firstside || side >= TSHAPE::NSides + 1) {
        DebugStop();
    }

    if (side < TSHAPE::NSides - 1) {
        return TPZCompElHDiv<TSHAPE>::GetSideOrient(side);
    }
    else if(side == TSHAPE::NSides-1) return fbottom_side_orient;
    else return ftop_side_orient;
}